

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_stack.cpp
# Opt level: O2

bool test6(void)

{
  pointer piVar1;
  int iVar2;
  ostream *poVar3;
  pointer piVar4;
  Stack s2;
  Stack s3;
  _Vector_base<int,_std::allocator<int>_> local_68;
  _Vector_base<int,_std::allocator<int>_> local_48;
  _Vector_base<int,_std::allocator<int>_> local_28;
  
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar2 = 0;
  while (local_68._M_impl.super__Vector_impl_data._M_start =
              (pointer)CONCAT44(local_68._M_impl.super__Vector_impl_data._M_start._4_4_,iVar2),
        iVar2 < 1000000) {
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&local_48,(value_type_conflict *)&local_68);
    iVar2 = (int)local_68._M_impl.super__Vector_impl_data._M_start + 1;
  }
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  piVar1 = local_48._M_impl.super__Vector_impl_data._M_finish + -0x7a121;
  local_48._M_impl.super__Vector_impl_data._M_finish =
       local_48._M_impl.super__Vector_impl_data._M_finish + -500000;
  while (piVar4 = piVar1, piVar4 + 1 != local_48._M_impl.super__Vector_impl_data._M_start) {
    local_48._M_impl.super__Vector_impl_data._M_finish = piVar4;
    piVar1 = piVar4 + -1;
  }
  local_28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::ostream::_M_insert<bool>(SUB81(poVar3,0));
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::ostream::_M_insert<bool>(SUB81(poVar3,0));
  poVar3 = (ostream *)
           std::ostream::operator<<(poVar3,local_68._M_impl.super__Vector_impl_data._M_finish[-1]);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::ostream::_M_insert<bool>(SUB81(poVar3,0));
  std::endl<char,std::char_traits<char>>(poVar3);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_28);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_68);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  return true;
}

Assistant:

bool test6() {
  int n = 1000000;
  Stack s1;
  for (int i = 0;i < n;i++) { s1.push(i); }
  for (int i = 0;i < n/2;i++) { s1.pop(); }
  Stack s2(s1);
  while (!s1.empty()) { s1.pop(); }
  Stack s3(s1);

  cout << s1.size() << " " << s1.empty() << endl;
  cout << s2.size() << " " << s2.empty() << s2.top() << endl;
  cout << s3.size() << " " << s3.empty() << endl;
  return true;
}